

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

float * __thiscall cimg_library::CImg<float>::max_min<float>(CImg<float> *this,float *min_val)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  float *pfVar6;
  bool bVar7;
  CImgInstanceException *this_00;
  char *pcVar8;
  char *pcVar9;
  unsigned_long uVar10;
  float val;
  float *_maxptrs;
  float *ptrs;
  float min_value;
  float max_value;
  float *ptr_max;
  float *min_val_local;
  CImg<float> *this_local;
  
  bVar7 = is_empty(this);
  if (!bVar7) {
    _min_value = this->_data;
    ptrs._0_4_ = *_min_value;
    _maxptrs = this->_data;
    pfVar6 = this->_data;
    uVar10 = size(this);
    ptrs._4_4_ = ptrs._0_4_;
    for (; _maxptrs < pfVar6 + uVar10; _maxptrs = _maxptrs + 1) {
      fVar1 = *_maxptrs;
      if (ptrs._4_4_ < fVar1) {
        _min_value = _maxptrs;
        ptrs._4_4_ = fVar1;
      }
      if (fVar1 < ptrs._0_4_) {
        ptrs._0_4_ = fVar1;
      }
    }
    *min_val = ptrs._0_4_;
    return _min_value;
  }
  this_00 = (CImgInstanceException *)__cxa_allocate_exception(0x4008);
  uVar2 = this->_width;
  uVar3 = this->_height;
  uVar4 = this->_depth;
  uVar5 = this->_spectrum;
  pfVar6 = this->_data;
  pcVar8 = "non-";
  if ((this->_is_shared & 1U) != 0) {
    pcVar8 = "";
  }
  pcVar9 = pixel_type();
  CImgInstanceException::CImgInstanceException
            (this_00,"[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::max_min(): Empty instance.",
             (ulong)uVar2,(ulong)uVar3,(ulong)uVar4,(ulong)uVar5,pfVar6,pcVar8,pcVar9);
  __cxa_throw(this_00,&CImgInstanceException::typeinfo,CImgInstanceException::~CImgInstanceException
             );
}

Assistant:

const T& max_min(t& min_val) const {
      if (is_empty())
        throw CImgInstanceException(_cimg_instance
                                    "max_min(): Empty instance.",
                                    cimg_instance);
      const T *ptr_max = _data;
      T max_value = *ptr_max, min_value = max_value;
      cimg_for(*this,ptrs,T) {
        const T val = *ptrs;
        if (val>max_value) { max_value = val; ptr_max = ptrs; }
        if (val<min_value) min_value = val;
      }
      min_val = (t)min_value;
      return *ptr_max;
    }